

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectivePool(Parser *parser,int flags)

{
  pointer pFVar1;
  pointer *__ptr;
  _Head_base<0UL,_CAssemblerCommand_*,_false> local_38;
  _Head_base<0UL,_CAssemblerCommand_*,_false> local_30;
  _Head_base<0UL,_CAssemblerCommand_*,_false> local_28;
  pointer local_20;
  undefined4 local_18;
  Mode local_14;
  
  std::make_unique<CommandSequence>();
  pFVar1 = local_20;
  local_14 = 4;
  local_18 = 1;
  std::make_unique<CDirectiveAlignFill,int,CDirectiveAlignFill::Mode>((int *)&local_38,&local_14);
  local_28._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (CAssemblerCommand *)0x0;
  std::
  vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
  ::emplace_back<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>
            ((vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
              *)(pFVar1 + 1),
             (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)&local_28);
  if (local_28._M_head_impl != (CAssemblerCommand *)0x0) {
    (*(local_28._M_head_impl)->_vptr_CAssemblerCommand[1])();
  }
  local_28._M_head_impl = (CAssemblerCommand *)0x0;
  if (local_38._M_head_impl != (CAssemblerCommand *)0x0) {
    (*(local_38._M_head_impl)->_vptr_CAssemblerCommand[1])();
  }
  pFVar1 = local_20;
  std::make_unique<ArmPoolCommand>();
  local_30._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (CAssemblerCommand *)0x0;
  std::
  vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
  ::emplace_back<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>
            ((vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
              *)(pFVar1 + 1),
             (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)&local_30);
  if (local_30._M_head_impl != (CAssemblerCommand *)0x0) {
    (*(local_30._M_head_impl)->_vptr_CAssemblerCommand[1])();
  }
  local_30._M_head_impl = (CAssemblerCommand *)0x0;
  if (local_38._M_head_impl != (CAssemblerCommand *)0x0) {
    (*(local_38._M_head_impl)->_vptr_CAssemblerCommand[1])();
  }
  (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = local_20;
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectivePool(Parser& parser, int flags)
{
	auto seq = std::make_unique<CommandSequence>();
	seq->addCommand(std::make_unique<CDirectiveAlignFill>(4,CDirectiveAlignFill::AlignVirtual));
	seq->addCommand(std::make_unique<ArmPoolCommand>());

	return seq;
}